

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O0

int __thiscall
delegating_shared_control_block<BaseType,_DerivedType>::clone
          (delegating_shared_control_block<BaseType,_DerivedType> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  shared_ptr<shared_control_block<DerivedType>_> local_38;
  shared_ptr<delegating_shared_control_block<BaseType,_DerivedType>_> local_28;
  __fn *local_18;
  delegating_shared_control_block<BaseType,_DerivedType> *this_local;
  
  local_18 = __fn;
  this_local = this;
  peVar1 = std::
           __shared_ptr_access<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(__fn + 8));
  (*peVar1->_vptr_shared_control_block[2])();
  std::
  make_shared<delegating_shared_control_block<BaseType,DerivedType>,std::shared_ptr<shared_control_block<DerivedType>>>
            ((shared_ptr<shared_control_block<DerivedType>_> *)&local_28);
  std::shared_ptr<shared_control_block<BaseType>>::
  shared_ptr<delegating_shared_control_block<BaseType,DerivedType>,void>
            ((shared_ptr<shared_control_block<BaseType>> *)this,&local_28);
  std::shared_ptr<delegating_shared_control_block<BaseType,_DerivedType>_>::~shared_ptr(&local_28);
  std::shared_ptr<shared_control_block<DerivedType>_>::~shared_ptr(&local_38);
  return (int)this;
}

Assistant:

std::shared_ptr<shared_control_block<T>> clone() const override
  {
    return std::make_shared<delegating_shared_control_block>(delegate_->clone());
  }